

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

char * epoll_event_flags_dump(epoll_event *ev)

{
  char *__s;
  uint uVar1;
  long lVar2;
  size_t sVar3;
  
  uVar1 = ev->events;
  lVar2 = __tls_get_addr(&PTR_0010bfd0);
  __s = (char *)(lVar2 + 0x3130);
  snprintf(__s,0x400,"events=0x%08x (",(ulong)uVar1);
  if ((uVar1 & 1) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLIN ",8);
    *(undefined1 *)(lVar2 + 0x3138 + sVar3) = 0;
  }
  if ((uVar1 & 2) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLPRI",8);
    *(undefined2 *)(lVar2 + 0x3138 + sVar3) = 0x20;
  }
  if ((uVar1 & 4) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLOUT",8);
    *(undefined2 *)(lVar2 + 0x3138 + sVar3) = 0x20;
  }
  if ((uVar1 & 0x40) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLRDN",8);
    *(undefined8 *)(lVar2 + 0x3135 + sVar3) = 0x204d524f4e4452;
  }
  if ((char)uVar1 < '\0') {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLRDB",8);
    *(undefined8 *)(lVar2 + 0x3135 + sVar3) = 0x20444e41424452;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLWRN",8);
    *(undefined8 *)(lVar2 + 0x3135 + sVar3) = 0x204d524f4e5257;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLWRB",8);
    *(undefined8 *)(lVar2 + 0x3135 + sVar3) = 0x20444e41425257;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLMSG",8);
    *(undefined2 *)(lVar2 + 0x3138 + sVar3) = 0x20;
  }
  if ((uVar1 & 8) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLERR",8);
    *(undefined2 *)(lVar2 + 0x3138 + sVar3) = 0x20;
  }
  if ((uVar1 & 0x10) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLHUP",8);
    *(undefined2 *)(lVar2 + 0x3138 + sVar3) = 0x20;
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLRDH",8);
    *(undefined4 *)(lVar2 + 0x3138 + sVar3) = 0x205055;
  }
  if ((uVar1 >> 0x1e & 1) != 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLONE",8);
    *(undefined8 *)(lVar2 + 0x3136 + sVar3) = 0x20544f4853454e;
  }
  if ((int)uVar1 < 0) {
    sVar3 = strlen(__s);
    builtin_strncpy(__s + sVar3,"EPOLLET ",8);
    *(undefined1 *)(lVar2 + 0x3138 + sVar3) = 0;
  }
  sVar3 = strlen(__s);
  if (__s[sVar3 - 1] == ' ') {
    *(undefined1 *)(lVar2 + 0x312f + sVar3) = 0;
  }
  sVar3 = strlen(__s);
  (__s + sVar3)[0] = ')';
  (__s + sVar3)[1] = '\0';
  return __s;
}

Assistant:

const char *
epoll_event_flags_dump(const struct epoll_event *ev)
{
    return epoll_flags_dump(ev->events);
}